

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O0

int h264_dec_ref_pic_marking(bitstream *str,int idr_pic_flag,h264_dec_ref_pic_marking *ref)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  int i;
  h264_mmco_entry mmco;
  int in_stack_ffffffffffffffbc;
  uint32_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 uStack_30;
  undefined8 local_2c;
  undefined4 local_24;
  
  if (in_ESI == 0) {
    iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
    if (*(int *)(in_RDX + 8) != 0) {
      iVar1 = 0;
      do {
        if (*in_RDI == 0) {
          puVar3 = (undefined8 *)(*(long *)(in_RDX + 0x10) + (long)iVar1 * 0x14);
          in_stack_ffffffffffffffcc = (uint)*puVar3;
          uStack_30 = (undefined4)((ulong)*puVar3 >> 0x20);
          local_2c = puVar3[1];
          local_24 = *(undefined4 *)(puVar3 + 2);
        }
        iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                      in_stack_ffffffffffffffc0);
        if (iVar2 != 0) {
          return 1;
        }
        in_stack_ffffffffffffffc0 = (uint32_t *)(ulong)in_stack_ffffffffffffffcc;
        switch(in_stack_ffffffffffffffc0) {
        case (uint32_t *)0x0:
          break;
        case (uint32_t *)0x1:
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        in_stack_ffffffffffffffc0);
          if (iVar2 != 0) {
            return 1;
          }
          break;
        case (uint32_t *)0x2:
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        in_stack_ffffffffffffffc0);
          if (iVar2 != 0) {
            return 1;
          }
          break;
        case (uint32_t *)0x3:
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        in_stack_ffffffffffffffc0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        in_stack_ffffffffffffffc0);
          if (iVar2 != 0) {
            return 1;
          }
          break;
        case (uint32_t *)0x4:
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        in_stack_ffffffffffffffc0);
          if (iVar2 != 0) {
            return 1;
          }
          break;
        case (uint32_t *)0x5:
          break;
        case (uint32_t *)0x6:
          iVar2 = vs_ue((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,iVar1),
                        in_stack_ffffffffffffffc0);
          if (iVar2 != 0) {
            return 1;
          }
          break;
        default:
          fprintf(_stderr,"Unknown MMCO %d\n",(ulong)in_stack_ffffffffffffffcc);
          return 1;
        }
        if (*in_RDI == 1) {
          if (*(int *)(in_RDX + 0x1c) <= *(int *)(in_RDX + 0x18)) {
            if (*(int *)(in_RDX + 0x1c) == 0) {
              *(undefined4 *)(in_RDX + 0x1c) = 0x10;
            }
            else {
              *(int *)(in_RDX + 0x1c) = *(int *)(in_RDX + 0x1c) << 1;
            }
            pvVar4 = realloc(*(void **)(in_RDX + 0x10),(long)*(int *)(in_RDX + 0x1c) * 0x14);
            *(void **)(in_RDX + 0x10) = pvVar4;
          }
          iVar2 = *(int *)(in_RDX + 0x18);
          *(int *)(in_RDX + 0x18) = iVar2 + 1;
          puVar3 = (undefined8 *)(*(long *)(in_RDX + 0x10) + (long)iVar2 * 0x14);
          *puVar3 = CONCAT44(uStack_30,in_stack_ffffffffffffffcc);
          puVar3[1] = local_2c;
          *(undefined4 *)(puVar3 + 2) = local_24;
        }
        iVar1 = iVar1 + 1;
      } while (in_stack_ffffffffffffffcc != 0);
    }
  }
  else {
    iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_dec_ref_pic_marking(struct bitstream *str, int idr_pic_flag, struct h264_dec_ref_pic_marking *ref) {
	if (idr_pic_flag) {
		if (vs_u(str, &ref->no_output_of_prior_pics_flag, 1)) return 1;
		if (vs_u(str, &ref->long_term_reference_flag, 1)) return 1;
	} else {
		if (vs_u(str, &ref->adaptive_ref_pic_marking_mode_flag, 1)) return 1;
		if (ref->adaptive_ref_pic_marking_mode_flag) {
			struct h264_mmco_entry mmco;
			int i = 0;
			do {
				if (str->dir == VS_ENCODE)
					mmco = ref->mmcos[i];
				if (vs_ue(str, &mmco.memory_management_control_operation)) return 1;
				switch (mmco.memory_management_control_operation) {
					case H264_MMCO_END:
						break;
					case H264_MMCO_FORGET_SHORT:
						if (vs_ue(str, &mmco.difference_of_pic_nums_minus1)) return 1;
						break;
					case H264_MMCO_FORGET_LONG:
						if (vs_ue(str, &mmco.long_term_pic_num)) return 1;
						break;
					case H264_MMCO_SHORT_TO_LONG:
						if (vs_ue(str, &mmco.difference_of_pic_nums_minus1)) return 1;
						if (vs_ue(str, &mmco.long_term_frame_idx)) return 1;
						break;
					case H264_MMCO_FORGET_LONG_MANY:
						if (vs_ue(str, &mmco.max_long_term_frame_idx_plus1)) return 1;
						break;
					case H264_MMCO_FORGET_ALL:
						break;
					case H264_MMCO_THIS_TO_LONG:
						if (vs_ue(str, &mmco.long_term_frame_idx)) return 1;
						break;
					default:
						fprintf (stderr, "Unknown MMCO %d\n", mmco.memory_management_control_operation);
						return 1;
				}
				if (str->dir == VS_DECODE) 
					ADDARRAY(ref->mmcos, mmco);
				i++;
			} while (mmco.memory_management_control_operation != H264_MMCO_END);
		}
	}
	return 0;
}